

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Point::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Point *this)

{
  TestOptions *opt;
  MthdVtxX32 *pMVar1;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar2;
  SingleMthdTest *this_00;
  result_type rVar3;
  MthdVtxXy *pMVar4;
  MthdVtxY32 *this_01;
  MthdSolidColor *pMVar5;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type aStack_188;
  allocator local_187;
  allocator local_186;
  allocator local_185;
  allocator local_184;
  allocator local_183;
  allocator local_182;
  allocator local_181;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_180;
  MthdVtxX32 *local_178;
  MthdSolidColor *local_170;
  MthdVtxY32 *local_168;
  MthdVtxXy *local_160;
  SingleMthdTest *local_158;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  SingleMthdTest *local_68;
  MthdSolidColor *local_60;
  MthdVtxXy *local_58;
  MthdVtxX32 *local_50;
  MthdVtxY32 *local_48;
  MthdSolidColor *local_40;
  MthdVtxXy *local_38;
  
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_180 = &(this->super_Class).rnd;
  local_158 = this_00;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_180);
  local_150 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_88,"notify",&local_181);
  opt = &(this->super_Class).opt;
  MthdNotify::SingleMthdTest
            ((MthdNotify *)this_00,opt,(uint32_t)rVar3,&local_88,-1,(this->super_Class).cls,0x104,1,
             4);
  local_68 = this_00;
  local_170 = (MthdSolidColor *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_180);
  std::__cxx11::string::string((string *)&local_a8,"color",&local_182);
  pMVar5 = local_170;
  MthdSolidColor::SingleMthdTest
            (local_170,opt,(uint32_t)rVar3,&local_a8,-1,(this->super_Class).cls,0x304,1,4);
  local_60 = pMVar5;
  pMVar4 = (MthdVtxXy *)operator_new(0x25958);
  local_160 = pMVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_180);
  std::__cxx11::string::string((string *)&local_c8,"point.xy",&local_183);
  MthdVtxXy::MthdVtxXy
            (pMVar4,opt,(uint32_t)rVar3,&local_c8,-1,(this->super_Class).cls,0x400,0x20,4,5);
  local_58 = pMVar4;
  local_178 = (MthdVtxX32 *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_180);
  std::__cxx11::string::string((string *)&local_e8,"point32.x",&local_184);
  pMVar1 = local_178;
  MthdVtxX32::MthdVtxX32
            (local_178,opt,(uint32_t)rVar3,&local_e8,-1,(this->super_Class).cls,0x480,0x10,8,5);
  local_50 = pMVar1;
  this_01 = (MthdVtxY32 *)operator_new(0x25958);
  local_168 = this_01;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_180);
  std::__cxx11::string::string((string *)&local_108,"point32.y",&local_185);
  MthdVtxY32::MthdVtxY32
            (this_01,opt,(uint32_t)rVar3,&local_108,-1,(this->super_Class).cls,0x484,0x10,8,5);
  local_48 = this_01;
  pMVar5 = (MthdSolidColor *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_180);
  std::__cxx11::string::string((string *)&local_128,"cpoint.color",&local_186);
  MthdSolidColor::SingleMthdTest
            (pMVar5,opt,(uint32_t)rVar3,&local_128,-1,(this->super_Class).cls,0x500,0x10,8);
  local_40 = pMVar5;
  pMVar4 = (MthdVtxXy *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_180);
  std::__cxx11::string::string((string *)&local_148,"cpoint.xy",&local_187);
  MthdVtxXy::MthdVtxXy
            (pMVar4,opt,(uint32_t)rVar3,&local_148,-1,(this->super_Class).cls,0x504,0x10,8,5);
  pvVar2 = local_150;
  __l._M_len = 7;
  __l._M_array = &local_68;
  local_38 = pMVar4;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_150,__l,&aStack_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return pvVar2;
}

Assistant:

std::vector<SingleMthdTest *> Point::mthds() {
	return {
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdSolidColor(opt, rnd(), "color", -1, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "point.xy", -1, cls, 0x400, 0x20, 4, VTX_FIRST | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "point32.x", -1, cls, 0x480, 0x10, 8, VTX_FIRST | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "point32.y", -1, cls, 0x484, 0x10, 8, VTX_FIRST | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpoint.color", -1, cls, 0x500, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpoint.xy", -1, cls, 0x504, 0x10, 8, VTX_FIRST | VTX_DRAW),
	};
}